

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineOffsetCache.cpp
# Opt level: O0

void __thiscall
Js::LineOffsetCache::BuildCache
          (LineOffsetCache *this,Recycler *allocator,LPCUTF8 sourceStartCharacter,
          LPCUTF8 sourceEndCharacter,charcount_t startingCharacterOffset,
          charcount_t startingByteOffset)

{
  code *pcVar1;
  LPCUTF8 this_00;
  bool bVar2;
  undefined4 *puVar3;
  ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer> **ppRVar4;
  Recycler *alloc;
  List<unsigned_int,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer> *this_01;
  TrackAllocData local_58;
  charcount_t local_30;
  charcount_t local_2c;
  charcount_t startingByteOffset_local;
  charcount_t startingCharacterOffset_local;
  LPCUTF8 sourceEndCharacter_local;
  LPCUTF8 sourceStartCharacter_local;
  Recycler *allocator_local;
  LineOffsetCache *this_local;
  
  local_30 = startingByteOffset;
  local_2c = startingCharacterOffset;
  _startingByteOffset_local = sourceEndCharacter;
  sourceEndCharacter_local = sourceStartCharacter;
  sourceStartCharacter_local = (LPCUTF8)allocator;
  allocator_local = (Recycler *)this;
  if (sourceStartCharacter == (LPCUTF8)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/LineOffsetCache.cpp"
                                ,199,"(sourceStartCharacter)",
                                "The source start character passed in is null.");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (_startingByteOffset_local == (LPCUTF8)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/LineOffsetCache.cpp"
                                ,200,"(sourceEndCharacter)",
                                "The source end character passed in is null.");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (_startingByteOffset_local < sourceEndCharacter_local) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/LineOffsetCache.cpp"
                                ,0xc9,"(sourceStartCharacter <= sourceEndCharacter)",
                                "The source start character should not be beyond the source end character."
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  ppRVar4 = Memory::WriteBarrierPtr::operator_cast_to_ReadOnlyList__((WriteBarrierPtr *)this);
  if (*ppRVar4 != (ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer> *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/LineOffsetCache.cpp"
                                ,0xca,"(!this->lineCharacterOffsetCacheList)",
                                "The cache is already built.");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  this_00 = sourceStartCharacter_local;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_58,
             (type_info *)
             &JsUtil::List<unsigned_int,Memory::Recycler,true,Js::CopyRemovePolicy,DefaultComparer>
              ::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/LineOffsetCache.cpp"
             ,0xcc);
  alloc = Memory::Recycler::TrackAllocInfo((Recycler *)this_00,&local_58);
  this_01 = (List<unsigned_int,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer> *)
            new<Memory::Recycler>(0x30,alloc,0x43c4b0);
  JsUtil::List<unsigned_int,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer>::List
            (this_01,(Recycler *)sourceStartCharacter_local,4);
  Memory::WriteBarrierPtr<JsUtil::ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>_>::
  operator=(&this->lineCharacterOffsetCacheList,
            (ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer> *)this_01);
  AddLine(this,(Recycler *)sourceStartCharacter_local,local_2c,local_30);
  while( true ) {
    bVar2 = FindNextLine(&sourceEndCharacter_local,_startingByteOffset_local,&local_2c,&local_30,
                         0xffffffff);
    if (!bVar2) break;
    AddLine(this,(Recycler *)sourceStartCharacter_local,local_2c,local_30);
  }
  return;
}

Assistant:

void LineOffsetCache::BuildCache(Recycler * allocator, _In_z_ LPCUTF8 sourceStartCharacter,
        _In_z_ LPCUTF8 sourceEndCharacter,
        charcount_t startingCharacterOffset,
        charcount_t startingByteOffset)
    {
        AssertMsg(sourceStartCharacter, "The source start character passed in is null.");
        AssertMsg(sourceEndCharacter, "The source end character passed in is null.");
        AssertMsg(sourceStartCharacter <= sourceEndCharacter, "The source start character should not be beyond the source end character.");
        AssertMsg(!this->lineCharacterOffsetCacheList, "The cache is already built.");

        this->lineCharacterOffsetCacheList = RecyclerNew(allocator, LineOffsetCacheList, allocator);

        // Add the first line in the cache list.
        this->AddLine(allocator, startingCharacterOffset, startingByteOffset);

        while (FindNextLine(sourceStartCharacter, sourceEndCharacter, startingCharacterOffset, startingByteOffset))
        {
            this->AddLine(allocator, startingCharacterOffset, startingByteOffset);
        }

    }